

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O2

int ptls_hkdf_extract(ptls_hash_algorithm_t *algo,void *output,ptls_iovec_t salt,ptls_iovec_t ikm)

{
  ptls_hash_context_t *ppVar1;
  size_t key_size;
  uint8_t *key;
  int iVar2;
  
  key_size = salt.len;
  key = salt.base;
  if (key_size == 0) {
    key_size = algo->digest_size;
    key = "";
  }
  ppVar1 = ptls_hmac_create(algo,key,key_size);
  if (ppVar1 == (ptls_hash_context_t *)0x0) {
    iVar2 = 0x201;
  }
  else {
    (*ppVar1->update)(ppVar1,ikm.base,ikm.len);
    iVar2 = 0;
    (*ppVar1->final)(ppVar1,output,PTLS_HASH_FINAL_MODE_FREE);
  }
  return iVar2;
}

Assistant:

int ptls_hkdf_extract(ptls_hash_algorithm_t *algo, void *output, ptls_iovec_t salt, ptls_iovec_t ikm)
{
    ptls_hash_context_t *hash;

    if (salt.len == 0)
        salt = ptls_iovec_init(zeroes_of_max_digest_size, algo->digest_size);

    if ((hash = ptls_hmac_create(algo, salt.base, salt.len)) == NULL)
        return PTLS_ERROR_NO_MEMORY;
    hash->update(hash, ikm.base, ikm.len);
    hash->final(hash, output, PTLS_HASH_FINAL_MODE_FREE);
    return 0;
}